

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O3

void predict_or_learn_adaptive<true>(boosting *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  pointer pfVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_78;
  float local_74;
  float local_70;
  
  fVar2 = ec->weight;
  iVar5 = o->t + 1;
  fVar9 = (float)iVar5;
  o->t = iVar5;
  fVar14 = 0.0;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = merand48(&o->all->random_state);
  if (0 < o->N) {
    lVar8 = 0;
    fVar16 = 0.0;
    fVar14 = 0.0;
    local_70 = 0.0;
    local_74 = 0.0;
    local_78 = 0.0;
    do {
      fVar11 = expf(local_74);
      ec->weight = (1.0 / (fVar11 + 1.0)) * fVar2;
      iVar5 = (int)lVar8;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar5);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar5);
      fVar11 = (ec->l).simple.label;
      fVar13 = (ec->pred).scalar;
      pfVar6 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar3 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      fVar12 = fVar13 * fVar3;
      local_70 = local_70 + fVar12;
      fVar4 = pfVar6[lVar8];
      fVar15 = fVar4;
      if (fVar11 * local_70 < 0.0) {
        pfVar6[lVar8] = fVar4 * 0.36788;
        fVar15 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
      }
      fVar11 = fVar11 * fVar13;
      local_74 = local_74 + fVar3 * fVar11;
      fVar13 = expf(local_74);
      pfVar6 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar6[lVar8] = (fVar11 * (4.0 / fVar9)) / (fVar13 + 1.0) + pfVar6[lVar8];
      pfVar6 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar11 = pfVar6[lVar8];
      if (2.0 < fVar11) {
        pfVar6[lVar8] = 2.0;
        pfVar6 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar11 = pfVar6[lVar8];
      }
      if (fVar11 < -2.0) {
        pfVar6[lVar8] = -2.0;
      }
      fVar14 = (float)(-(uint)(fVar10 < fVar16) & (uint)fVar14 |
                      ~-(uint)(fVar10 < fVar16) & (uint)(fVar12 + fVar14));
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar5);
      fVar16 = fVar16 + fVar4;
      local_78 = local_78 + fVar15;
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar5);
      lVar8 = lVar8 + 1;
      uVar7 = (ulong)o->N;
    } while (lVar8 < (long)uVar7);
    if (0 < o->N) {
      lVar8 = 0;
      do {
        if ((local_78 != 0.0) || (NAN(local_78))) {
          pfVar6 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar6[lVar8] = pfVar6[lVar8] / local_78;
          uVar7 = (ulong)(uint)o->N;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)uVar7);
    }
  }
  ec->weight = fVar2;
  ec->partial_prediction = fVar14;
  fVar14 = *(float *)(&DAT_002785e8 + (ulong)(0.0 < fVar14) * 4);
  (ec->pred).scalar = fVar14;
  ec->loss = (float)(~-(uint)(fVar14 == (ec->l).simple.label) & (uint)fVar2);
  return;
}

Assistant:

void predict_or_learn_adaptive(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0, partial_prediction = 0;

  float s = 0;
  float v_normalization = 0, v_partial_sum = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / (float)sqrtf((float)o.t);

  float stopping_point = merand48(o.all->random_state);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;

      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }

      partial_prediction += ec.pred.scalar * o.alpha[i];

      v_partial_sum += o.v[i];

      // update v, exp(-1) = 0.36788
      if (ld.label * partial_prediction < 0)
      {
        o.v[i] *= 0.36788f;
      }
      v_normalization += o.v[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }
      else
      {
        // stopping at learner i
        break;
      }
      v_partial_sum += o.v[i];
    }
  }

  // normalize v vector in training
  if (is_learn)
  {
    for (int i = 0; i < o.N; i++)
    {
      if (v_normalization)
        o.v[i] /= v_normalization;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}